

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O2

int utest_should_filter_test(char *filter,char *testcase)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = filter;
  if (filter != (char *)0x0) {
LAB_0010ae20:
    do {
      while( true ) {
        cVar1 = *pcVar4;
        cVar2 = *testcase;
        iVar3 = 1;
        if (cVar1 == '\0') {
          if (cVar2 == '\0') {
            return 0;
          }
          if (pcVar4 == filter) {
            return 1;
          }
          return (uint)(pcVar4[-1] != '*');
        }
        if (cVar2 == '\0') {
          return iVar3;
        }
        pcVar5 = pcVar4;
        if (cVar1 == '*') break;
        if (cVar2 != cVar1) {
          return iVar3;
        }
        testcase = testcase + 1;
        pcVar4 = pcVar4 + 1;
      }
      while( true ) {
        cVar1 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
        cVar2 = *testcase;
        if (cVar1 == '\0') break;
        if ((cVar1 == '*') || (cVar2 == '\0')) {
          pcVar4 = pcVar5;
          if (cVar2 == '\0') {
            return iVar3;
          }
          goto LAB_0010ae20;
        }
        if (cVar1 != cVar2) {
          pcVar5 = pcVar4;
        }
        testcase = testcase + 1;
      }
      pcVar4 = pcVar5;
    } while (cVar2 != '\0');
  }
  return 0;
}

Assistant:

UTEST_WEAK int utest_should_filter_test(const char *filter,
                                        const char *testcase) {
  if (filter) {
    const char *filter_cur = filter;
    const char *testcase_cur = testcase;
    const char *filter_wildcard = 0;

    while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
      if ('*' == *filter_cur) {
        /* store the position of the wildcard */
        filter_wildcard = filter_cur;

        /* skip the wildcard character */
        filter_cur++;

        while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
          if ('*' == *filter_cur) {
            /*
               we found another wildcard (filter is something like *foo*) so we
               exit the current loop, and return to the parent loop to handle
               the wildcard case
            */
            break;
          } else if (*filter_cur != *testcase_cur) {
            /* otherwise our filter didn't match, so reset it */
            filter_cur = filter_wildcard;
          }

          /* move testcase along */
          testcase_cur++;

          /* move filter along */
          filter_cur++;
        }

        if (('\0' == *filter_cur) && ('\0' == *testcase_cur)) {
          return 0;
        }

        /* if the testcase has been exhausted, we don't have a match! */
        if ('\0' == *testcase_cur) {
          return 1;
        }
      } else {
        if (*testcase_cur != *filter_cur) {
          /* test case doesn't match filter */
          return 1;
        } else {
          /* move our filter and testcase forward */
          testcase_cur++;
          filter_cur++;
        }
      }
    }

    if (('\0' != *filter_cur) ||
        (('\0' != *testcase_cur) &&
         ((filter == filter_cur) || ('*' != filter_cur[-1])))) {
      /* we have a mismatch! */
      return 1;
    }
  }

  return 0;
}